

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O2

void __thiscall
onmt::SentencePieceLearner::SentencePieceLearner
          (SentencePieceLearner *this,bool verbose,string *opts,string *input_filename,
          bool keep_vocab,bool keep_input_file)

{
  SubwordLearner::SubwordLearner(&this->super_SubwordLearner,verbose,(Tokenizer *)0x0);
  (this->super_SubwordLearner)._vptr_SubwordLearner =
       (_func_int **)&PTR__SentencePieceLearner_003b5f18;
  std::__cxx11::string::string((string *)&this->_args,(string *)opts);
  std::__cxx11::string::string((string *)&this->_input_filename,(string *)input_filename);
  this->_keep_vocab = keep_vocab;
  (this->_input_stream)._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
  this->_keep_input_file = keep_input_file;
  return;
}

Assistant:

SentencePieceLearner::SentencePieceLearner(bool verbose,
                                             const std::string& opts,
                                             const std::string& input_filename,
                                             bool keep_vocab,
                                             bool keep_input_file)
    : SubwordLearner(verbose)
    , _args(opts)
    , _input_filename(input_filename)
    , _keep_vocab(keep_vocab)
    , _keep_input_file(keep_input_file)
  {
  }